

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  WhereTerm *pWVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  WhereTerm *pWVar10;
  long in_FS_OFFSET;
  bool bVar11;
  int k;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = pLoop->maskSelf;
  uVar3 = pLoop->prereq;
  iVar9 = pWC->nBase;
  pWVar10 = pWC->a;
  uVar8 = 0;
  do {
    if (iVar9 < 1) {
      if ((int)((int)nRow - uVar8) < (int)pLoop->nOut) {
        pLoop->nOut = (LogEst)((int)nRow - uVar8);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    if ((((pWVar10->prereqAll & ~(uVar2 | uVar3)) == 0) &&
        ((pLoop->maskSelf & pWVar10->prereqAll) != 0)) && ((pWVar10->wtFlags & 2) == 0)) {
      uVar6 = (ulong)pLoop->nLTerm;
      while (bVar11 = uVar6 != 0, uVar6 = uVar6 - 1, bVar11) {
        pWVar4 = pLoop->aLTerm[uVar6];
        if ((pWVar4 != (WhereTerm *)0x0) &&
           ((pWVar4 == pWVar10 ||
            ((-1 < (long)pWVar4->iParent && (pWC->a + pWVar4->iParent == pWVar10))))))
        goto LAB_0018ca7d;
      }
      sqlite3ProgressCheck(pWC->pWInfo->pParse);
      if ((pLoop->maskSelf == pWVar10->prereqAll) &&
         (((pWVar10->eOperator & 0x3f) != 0 ||
          ((pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype & 0x48) == 0)))) {
        pbVar1 = (byte *)((long)&pLoop->wsFlags + 2);
        *pbVar1 = *pbVar1 | 0x80;
      }
      if (pWVar10->truthProb < 1) {
        pLoop->nOut = pLoop->nOut + pWVar10->truthProb;
      }
      else {
        pLoop->nOut = pLoop->nOut + -1;
        if ((pWVar10->eOperator & 0x82) != 0) {
          k = 0;
          iVar5 = sqlite3ExprIsInteger(pWVar10->pExpr->pRight,&k,(Parse *)0x0);
          uVar7 = 0x14;
          if (k + 1U < 3) {
            uVar7 = 10;
          }
          if (iVar5 == 0) {
            uVar7 = 0x14;
          }
          if (uVar8 < uVar7) {
            pbVar1 = (byte *)((long)&pWVar10->wtFlags + 1);
            *pbVar1 = *pbVar1 | 0x20;
            uVar8 = uVar7;
          }
        }
      }
    }
LAB_0018ca7d:
    iVar9 = iVar9 + -1;
    pWVar10 = pWVar10 + 1;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nBase, pTerm=pWC->a; i>0; i--, pTerm++){
    assert( pTerm!=0 );
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      sqlite3ProgressCheck(pWC->pWInfo->pParse);
      if( pLoop->maskSelf==pTerm->prereqAll ){
        /* If there are extra terms in the WHERE clause not used by an index
        ** that depend only on the table being scanned, and that will tend to
        ** cause many rows to be omitted, then mark that table as
        ** "self-culling".
        **
        ** 2022-03-24:  Self-culling only applies if either the extra terms
        ** are straight comparison operators that are non-true with NULL
        ** operand, or if the loop is not an OUTER JOIN.
        */
        if( (pTerm->eOperator & 0x3f)!=0
         || (pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype
                  & (JT_LEFT|JT_LTORJ))==0
        ){
          pLoop->wsFlags |= WHERE_SELFCULL;
        }
      }
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0
         && (pTerm->wtFlags & TERM_HIGHTRUTH)==0  /* tag-20200224-1 */
        ){
          Expr *pRight = pTerm->pExpr->pRight;
          int k = 0;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k, 0) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ){
            pTerm->wtFlags |= TERM_HEURTRUTH;
            iReduce = k;
          }
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce ){
    pLoop->nOut = nRow - iReduce;
  }
}